

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

void __thiscall
el::base::LogFormat::updateDateFormat(LogFormat *this,size_t index,string_t *currFormat)

{
  string sVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  stringstream ss;
  string local_1d8;
  undefined7 uStack_1d7;
  undefined1 local_1c8 [16];
  ostream *local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar4 = index + 9;
  if ((this->m_flags & 2) == 0) {
    uVar4 = index;
  }
  if ((uVar4 < currFormat->_M_string_length) &&
     (pcVar2 = (currFormat->_M_dataplus)._M_p + uVar4, *pcVar2 == '{')) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    for (lVar3 = 1;
        (sVar1 = *(string *)(pcVar2 + lVar3), sVar1 != (string)0x0 && (sVar1 != (string)0x7d));
        lVar3 = lVar3 + 1) {
      local_1d8 = sVar1;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1d8,1);
    }
    std::__cxx11::string::erase((ulong)currFormat,uVar4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->m_dateTimeFormat,&local_1d8);
    if ((undefined1 *)CONCAT71(uStack_1d7,local_1d8) != local_1c8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1d7,local_1d8));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  else if ((this->m_flags & 2) != 0) {
    local_1b8[0] = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"%Y-%M-%d %H:%m:%s,%g","");
    std::__cxx11::string::operator=((string *)&this->m_dateTimeFormat,(string *)local_1b8);
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0]);
    }
  }
  return;
}

Assistant:

void LogFormat::updateDateFormat(std::size_t index, base::type::string_t& currFormat) {
  if (hasFlag(base::FormatFlags::DateTime)) {
    index += ELPP_STRLEN(base::consts::kDateTimeFormatSpecifier);
  }
  const base::type::char_t* ptr = currFormat.c_str() + index;
  if ((currFormat.size() > index) && (ptr[0] == '{')) {
    // User has provided format for date/time
    ++ptr;
    int count = 1;  // Start by 1 in order to remove starting brace
    std::stringstream ss;
    for (; *ptr; ++ptr, ++count) {
      if (*ptr == '}') {
        ++count;  // In order to remove ending brace
        break;
      }
      ss << static_cast<char>(*ptr);
    }
    currFormat.erase(index, count);
    m_dateTimeFormat = ss.str();
  } else {
    // No format provided, use default
    if (hasFlag(base::FormatFlags::DateTime)) {
      m_dateTimeFormat = std::string(base::consts::kDefaultDateTimeFormat);
    }
  }
}